

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_crypto_tests.cpp
# Opt level: O0

void wallet::wallet_crypto_tests::TestCrypter::TestEncryptSingle
               (CCrypter *crypt,CKeyingMaterial *plaintext,
               span<const_unsigned_char,_18446744073709551615UL> correct_ciphertext)

{
  long lVar1;
  span<const_unsigned_char,_18446744073709551615UL> correct_plaintext;
  span<const_unsigned_char,_18446744073709551615UL> ciphertext_00;
  bool bVar2;
  __extent_storage<18446744073709551615UL> in_RDX;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ciphertext;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
  *in_stack_fffffffffffffea8;
  span<const_unsigned_char,_18446744073709551615UL> *in_stack_fffffffffffffeb0;
  span<const_unsigned_char,_18446744073709551615UL> *in_stack_fffffffffffffeb8;
  const_string *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  const_string *in_stack_fffffffffffffee0;
  unit_test_log_t *in_stack_fffffffffffffee8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff00;
  CKeyingMaterial *in_stack_ffffffffffffff08;
  CCrypter *in_stack_ffffffffffffff10;
  CCrypter *in_stack_ffffffffffffff28;
  equal_coll_impl *in_stack_ffffffffffffff58;
  const_string local_a0;
  lazy_ostream local_90 [2];
  __normal_iterator<const_unsigned_char_*,_std::span<const_unsigned_char,_18446744073709551615UL>_>
  in_stack_ffffffffffffff90;
  __normal_iterator<const_unsigned_char_*,_std::span<const_unsigned_char,_18446744073709551615UL>_>
  in_stack_ffffffffffffff98;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffffa0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffffa8;
  pointer in_stack_ffffffffffffffd0;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffffd8;
  pointer in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffea8);
  CCrypter::Encrypt(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  bVar2 = std::span<const_unsigned_char,_18446744073709551615UL>::empty
                    ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffffea8)
  ;
  if (!bVar2) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffeb8,
                 (pointer)in_stack_fffffffffffffeb0,(unsigned_long)in_stack_fffffffffffffea8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffea8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                 in_stack_fffffffffffffed0);
      in_stack_fffffffffffffee0 = (const_string *)&stack0xffffffffffffffd0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffeb0)
      ;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffeb0)
      ;
      in_stack_fffffffffffffee8 = (unit_test_log_t *)&stack0xffffffffffffffe8;
      std::span<const_unsigned_char,_18446744073709551615UL>::begin(in_stack_fffffffffffffeb0);
      std::span<const_unsigned_char,_18446744073709551615UL>::end(in_stack_fffffffffffffeb8);
      boost::test_tools::tt_detail::equal_coll_impl::operator()
                (in_stack_ffffffffffffff58,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffeb0,(char (*) [1])in_stack_fffffffffffffea8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffeb8,
                 (pointer)in_stack_fffffffffffffeb0,(unsigned_long)in_stack_fffffffffffffea8);
      in_stack_fffffffffffffeb8 = (span<const_unsigned_char,_18446744073709551615UL> *)0x1ce4d6c;
      in_stack_fffffffffffffeb0 = (span<const_unsigned_char,_18446744073709551615UL> *)0x1ce4d51;
      in_stack_fffffffffffffea8 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
           &DAT_00000004;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&stack0xffffffffffffff98,local_90,&local_a0,0x42,CHECK,
                 CHECK_EQUAL_COLL);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl(in_stack_fffffffffffffea8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffea8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
            (in_stack_fffffffffffffeb8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffeb0);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&>
            (in_stack_fffffffffffffeb8,
             (vector<unsigned_char,_secure_allocator<unsigned_char>_> *)in_stack_fffffffffffffeb0);
  ciphertext_00._M_extent._M_extent_value = in_RDX._M_extent_value;
  ciphertext_00._M_ptr = in_stack_ffffffffffffffe0;
  correct_plaintext._M_extent._M_extent_value = in_stack_ffffffffffffffd8._M_extent_value;
  correct_plaintext._M_ptr = in_stack_ffffffffffffffd0;
  TestDecrypt(in_stack_ffffffffffffff28,ciphertext_00,correct_plaintext);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffeb8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void TestEncryptSingle(const CCrypter& crypt, const CKeyingMaterial& plaintext,
                              const std::span<const unsigned char> correct_ciphertext = {})
{
    std::vector<unsigned char> ciphertext;
    crypt.Encrypt(plaintext, ciphertext);

    if (!correct_ciphertext.empty()) {
        BOOST_CHECK_EQUAL_COLLECTIONS(ciphertext.begin(), ciphertext.end(), correct_ciphertext.begin(), correct_ciphertext.end());
    }

    TestDecrypt(crypt, ciphertext, /*correct_plaintext=*/plaintext);
}